

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O2

uint32_t BrotliBuildHuffmanTable
                   (HuffmanCode *root_table,int root_bits,uint16_t *symbol_lists,uint16_t *count)

{
  long lVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  uint32_t uVar5;
  uint16_t uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  HuffmanCode *pHVar15;
  uint32_t uVar16;
  long lVar17;
  long lVar18;
  uint32_t uVar19;
  bool bVar20;
  uint32_t local_74;
  ulong local_68;
  
  lVar18 = -1;
  do {
    lVar11 = lVar18;
    lVar18 = lVar11 + -1;
  } while (symbol_lists[lVar11] == 0xffff);
  bVar4 = (byte)root_bits;
  uVar19 = 1 << (bVar4 & 0x1f);
  iVar9 = (int)(lVar11 + 0x10);
  uVar16 = 1 << ((byte)(lVar11 + 0x10) & 0x1f);
  iVar14 = iVar9;
  if (root_bits <= iVar9) {
    uVar16 = uVar19;
    iVar14 = root_bits;
  }
  iVar7 = 2;
  uVar10 = 0x80;
  lVar11 = 0;
  lVar18 = 1;
  do {
    uVar12 = (uint)count[lVar18];
    uVar13 = (uint)lVar18 - 0x10;
    while (bVar20 = uVar12 != 0, uVar12 = uVar12 - 1, bVar20) {
      uVar13 = (uint)symbol_lists[(int)uVar13];
      bVar3 = ""[lVar11];
      uVar5 = uVar16;
      do {
        iVar8 = uVar5 - iVar7;
        uVar5 = uVar5 - iVar7;
        root_table[(ulong)bVar3 + (long)iVar8] = (HuffmanCode)(uVar13 << 0x10 | (uint)lVar18);
      } while (0 < (int)uVar5);
      lVar11 = lVar11 + uVar10;
    }
    iVar7 = iVar7 * 2;
    uVar10 = uVar10 >> 1;
    bVar20 = lVar18 < iVar14;
    lVar18 = lVar18 + 1;
  } while (bVar20);
  for (; uVar19 != uVar16; uVar16 = uVar16 * 2) {
    memcpy(root_table + (int)uVar16,root_table,(long)(int)uVar16 << 2);
  }
  local_68 = 0x80;
  iVar14 = 2;
  lVar17 = 0x100;
  lVar18 = (long)root_bits;
  pHVar15 = root_table;
  local_74 = uVar19;
  do {
    if (iVar9 <= lVar18) {
      return local_74;
    }
    lVar1 = lVar18 + 1;
    uVar12 = (int)lVar1 - root_bits;
    uVar13 = (int)lVar18 - 0xf;
    uVar6 = count[lVar1];
    while (uVar6 != 0) {
      if (lVar17 == 0x100) {
        pHVar15 = pHVar15 + (int)uVar19;
        iVar7 = 1 << ((byte)uVar12 & 0x1f);
        for (lVar18 = (long)(int)lVar1; lVar18 < 0xf; lVar18 = lVar18 + 1) {
          iVar8 = iVar7 - (uint)count[lVar18];
          if (iVar8 == 0 || iVar7 < (int)(uint)count[lVar18]) goto LAB_0013e54c;
          iVar7 = iVar8 * 2;
        }
        lVar18 = 0xf;
LAB_0013e54c:
        uVar19 = 1 << ((char)lVar18 - bVar4 & 0x1f);
        local_74 = local_74 + uVar19;
        pbVar2 = "" + lVar11;
        lVar11 = lVar11 + (0x80UL >> (bVar4 - 1 & 0x3f));
        root_table[*pbVar2] =
             (HuffmanCode)
             ((uint)lVar18 & 0xff |
             (((uint)((int)pHVar15 - (int)root_table) >> 2) - (uint)*pbVar2) * 0x10000);
        lVar17 = 0;
      }
      uVar13 = (uint)symbol_lists[(int)uVar13];
      bVar3 = ""[lVar17];
      uVar16 = uVar19;
      do {
        iVar7 = uVar16 - iVar14;
        uVar16 = uVar16 - iVar14;
        pHVar15[(ulong)bVar3 + (long)iVar7] = (HuffmanCode)(uVar13 << 0x10 | uVar12 & 0xff);
      } while (0 < (int)uVar16);
      lVar17 = lVar17 + local_68;
      uVar6 = count[lVar1] - 1;
      count[lVar1] = uVar6;
    }
    iVar14 = iVar14 * 2;
    local_68 = local_68 >> 1;
    lVar18 = lVar1;
  } while( true );
}

Assistant:

uint32_t BrotliBuildHuffmanTable(HuffmanCode* root_table,
                                 int root_bits,
                                 const uint16_t* const symbol_lists,
                                 uint16_t* count) {
  HuffmanCode code;       /* current table entry */
  HuffmanCode* table;     /* next available space in table */
  int len;                /* current code length */
  int symbol;             /* symbol index in original or sorted table */
  brotli_reg_t key;       /* prefix code */
  brotli_reg_t key_step;  /* prefix code addend */
  brotli_reg_t sub_key;   /* 2nd level table prefix code */
  brotli_reg_t sub_key_step;  /* 2nd level table prefix code addend */
  int step;               /* step size to replicate values in current table */
  int table_bits;         /* key length of current table */
  int table_size;         /* size of current table */
  int total_size;         /* sum of root table size and 2nd level table sizes */
  int max_length = -1;
  int bits;
  int bits_count;

  BROTLI_DCHECK(root_bits <= BROTLI_REVERSE_BITS_MAX);
  BROTLI_DCHECK(BROTLI_HUFFMAN_MAX_CODE_LENGTH - root_bits <=
                BROTLI_REVERSE_BITS_MAX);

  while (symbol_lists[max_length] == 0xFFFF) max_length--;
  max_length += BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1;

  table = root_table;
  table_bits = root_bits;
  table_size = 1 << table_bits;
  total_size = table_size;

  /* Fill in the root table. Reduce the table size to if possible,
     and create the repetitions by memcpy. */
  if (table_bits > max_length) {
    table_bits = max_length;
    table_size = 1 << table_bits;
  }
  key = 0;
  key_step = BROTLI_REVERSE_BITS_LOWEST;
  bits = 1;
  step = 2;
  do {
    symbol = bits - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
    for (bits_count = count[bits]; bits_count != 0; --bits_count) {
      symbol = symbol_lists[symbol];
      code = ConstructHuffmanCode((uint8_t)bits, (uint16_t)symbol);
      ReplicateValue(&table[BrotliReverseBits(key)], step, table_size, code);
      key += key_step;
    }
    step <<= 1;
    key_step >>= 1;
  } while (++bits <= table_bits);

  /* If root_bits != table_bits then replicate to fill the remaining slots. */
  while (total_size != table_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }

  /* Fill in 2nd level tables and add pointers to root table. */
  key_step = BROTLI_REVERSE_BITS_LOWEST >> (root_bits - 1);
  sub_key = (BROTLI_REVERSE_BITS_LOWEST << 1);
  sub_key_step = BROTLI_REVERSE_BITS_LOWEST;
  for (len = root_bits + 1, step = 2; len <= max_length; ++len) {
    symbol = len - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
    for (; count[len] != 0; --count[len]) {
      if (sub_key == (BROTLI_REVERSE_BITS_LOWEST << 1U)) {
        table += table_size;
        table_bits = NextTableBitSize(count, len, root_bits);
        table_size = 1 << table_bits;
        total_size += table_size;
        sub_key = BrotliReverseBits(key);
        key += key_step;
        root_table[sub_key] = ConstructHuffmanCode(
            (uint8_t)(table_bits + root_bits),
            (uint16_t)(((size_t)(table - root_table)) - sub_key));
        sub_key = 0;
      }
      symbol = symbol_lists[symbol];
      code = ConstructHuffmanCode((uint8_t)(len - root_bits), (uint16_t)symbol);
      ReplicateValue(
          &table[BrotliReverseBits(sub_key)], step, table_size, code);
      sub_key += sub_key_step;
    }
    step <<= 1;
    sub_key_step >>= 1;
  }
  return (uint32_t)total_size;
}